

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
DiceRoller::getPercentages
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,DiceRoller *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  bool bVar1;
  vector<double,_std::allocator<double>_> *this_01;
  reference piVar2;
  double local_48;
  int local_3c;
  iterator iStack_38;
  int x;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<double,_std::allocator<double>_> *percentages;
  DiceRoller *this_local;
  
  this_01 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
  memset(this_01,0,0x18);
  std::vector<double,_std::allocator<double>_>::vector(this_01);
  this_00 = this->history;
  __end1 = std::vector<int,_std::allocator<int>_>::begin(this_00);
  iStack_38 = std::vector<int,_std::allocator<int>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffc8);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    local_3c = *piVar2;
    local_48 = (double)local_3c / (double)*this->diceRolled;
    std::vector<double,_std::allocator<double>_>::push_back(this_01,&local_48);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,this_01);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> DiceRoller::getPercentages() {
    auto* percentages = new std::vector<double>();

    for (int x : *history) {
        percentages->push_back((double) x / (double) *diceRolled);
    }

    return *percentages;
}